

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

TextureLevel *
vkt::image::anon_unknown_0::generateReferenceImage
          (TextureLevel *__return_storage_ptr__,IVec3 *imageSize,VkFormat imageFormat,
          VkFormat readFormat)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  Float<unsigned_short,_5,_10,_15,_3U> FVar5;
  TextureLevel *pTVar6;
  TextureLevel *extraout_RAX;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ChannelType CVar10;
  int iVar11;
  int iVar12;
  ChannelType z;
  int i;
  long lVar13;
  ChannelType x;
  ChannelType CVar14;
  ChannelType y;
  int z_00;
  deUint32 u32;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  undefined1 auVar15 [12];
  float extraout_XMM0_Dd;
  IVec4 color;
  Vector<float,_4> res;
  PixelBufferAccess access;
  undefined1 local_128 [20];
  float afStack_114 [3];
  VkFormat local_108;
  VkFormat local_104;
  IVec3 *local_100;
  ChannelType local_f4;
  int local_f0;
  Float<unsigned_int,_8,_23,_127,_3U> local_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  TextureLevel *local_c8;
  TextureFormat local_c0;
  PixelBufferAccess local_b8;
  PixelBufferAccess local_90;
  PixelBufferAccess local_68;
  IVec3 local_40;
  undefined7 extraout_var;
  
  local_68.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(imageFormat);
  tcu::TextureLevel::TextureLevel
            (__return_storage_ptr__,(TextureFormat *)&local_68,imageSize->m_data[0],
             imageSize->m_data[1],imageSize->m_data[2]);
  local_c8 = __return_storage_ptr__;
  tcu::TextureLevel::getAccess(&local_68,__return_storage_ptr__);
  local_40.m_data[2] = imageSize->m_data[2];
  local_40.m_data._0_8_ = *(undefined8 *)imageSize->m_data;
  local_d8 = computeStoreColorScale(imageFormat,&local_40);
  fStack_d4 = extraout_XMM0_Db;
  fStack_d0 = extraout_XMM0_Dc;
  fStack_cc = extraout_XMM0_Dd;
  bVar4 = ::vk::isSnormFormat(imageFormat);
  if (bVar4) {
    auVar15 = ZEXT812(0xbf800000);
  }
  else {
    auVar15 = ZEXT812(0);
  }
  fStack_dc = 0.0;
  _local_e8 = auVar15;
  bVar4 = ::vk::isIntFormat(imageFormat);
  local_100 = (IVec3 *)CONCAT71(local_100._1_7_,1);
  if (!bVar4) {
    bVar4 = ::vk::isUintFormat(imageFormat);
    local_100 = (IVec3 *)CONCAT71(local_100._1_7_,bVar4);
  }
  iVar9 = imageSize->m_data[2];
  local_108 = readFormat;
  local_104 = imageFormat;
  if (0 < iVar9) {
    iVar11 = imageSize->m_data[0];
    iVar8 = imageSize->m_data[1];
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    local_e8._4_4_ = local_e8._0_4_;
    fStack_e0 = (float)local_e8._0_4_;
    fStack_dc = (float)local_e8._0_4_;
    local_f4 = iVar11 - SNORM_INT16;
    z = SNORM_INT8;
    local_f0 = iVar8;
    do {
      if (0 < iVar8) {
        y = SNORM_INT8;
        do {
          if (0 < iVar11) {
            CVar14 = ~y + local_f0 ^ z;
            x = SNORM_INT8;
            CVar10 = local_f4;
            do {
              local_128._0_4_ = y ^ z ^ x;
              local_128._4_4_ = y ^ z ^ CVar10;
              local_128._8_4_ = CVar14 ^ x;
              local_128._12_4_ = CVar14 ^ CVar10;
              if ((char)local_100 == '\0') {
                afStack_114[0] = (float)(int)local_128._4_4_ * fStack_d4 + (float)local_e8._4_4_;
                local_128._16_4_ = (float)(int)local_128._0_4_ * local_d8 + (float)local_e8._0_4_;
                afStack_114[2] = (float)(int)local_128._12_4_ * fStack_cc + fStack_dc;
                afStack_114[1] = (float)(int)local_128._8_4_ * fStack_d0 + fStack_e0;
                tcu::PixelBufferAccess::setPixel(&local_68,(Vec4 *)(local_128 + 0x10),x,y,z);
              }
              else {
                tcu::PixelBufferAccess::setPixel(&local_68,(IVec4 *)local_128,x,y,z);
              }
              x = x + SNORM_INT16;
              iVar11 = imageSize->m_data[0];
              CVar10 = CVar10 - SNORM_INT16;
            } while ((int)x < iVar11);
            iVar8 = imageSize->m_data[1];
            imageFormat = local_104;
          }
          y = y + SNORM_INT16;
        } while ((int)y < iVar8);
        iVar9 = imageSize->m_data[2];
        readFormat = local_108;
      }
      z = z + SNORM_INT16;
    } while ((int)z < iVar9);
  }
  bVar4 = ::vk::isFloatFormat(readFormat);
  if ((imageFormat != readFormat) && (bVar4)) {
    local_c0 = ::vk::mapVkFormat(readFormat);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_b8,&local_c0,imageSize,local_68.super_ConstPixelBufferAccess.m_data);
    imageFormat = local_104;
    local_100 = imageSize;
    if (0 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      iVar9 = 0;
      iVar11 = local_b8.super_ConstPixelBufferAccess.m_size.m_data[2];
      iVar8 = local_b8.super_ConstPixelBufferAccess.m_size.m_data[1];
      do {
        if (0 < iVar8) {
          z_00 = 0;
          iVar12 = local_b8.super_ConstPixelBufferAccess.m_size.m_data[0];
          do {
            if (0 < iVar12) {
              iVar11 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_128,(int)&local_b8,iVar11,z_00);
                afStack_114[0] = (float)local_128._4_4_;
                local_128._16_4_ = local_128._0_4_;
                afStack_114[1] = (float)local_128._8_4_;
                afStack_114[2] = (float)local_128._12_4_;
                lVar13 = 0;
                do {
                  if (local_b8.super_ConstPixelBufferAccess.m_format.type == HALF_FLOAT) {
                    local_ec.m_value = *(StorageType *)(local_128 + lVar13 * 4);
                    FVar5 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                                      (&local_ec);
                    if (((FVar5.m_value & 0x7fff) == 0x7c00) ||
                       ((FVar5.m_value & 0x3ff) != 0 &&
                        ((FVar5.m_value & 0x7c00) == 0 || (FVar5.m_value & 0x7c00) == 0x7c00))) {
LAB_007298eb:
                      afStack_114[lVar13 + -1] = 0.0;
                    }
                  }
                  else {
                    uVar2 = *(uint *)(local_128 + lVar13 * 4);
                    if (((uVar2 & 0x7fffffff) == 0x7f800000) ||
                       ((uVar2 & 0x7fffff) != 0 &&
                        ((uVar2 & 0x7f800000) == 0 || (uVar2 & 0x7f800000) == 0x7f800000)))
                    goto LAB_007298eb;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 4);
                if (((float)local_128._16_4_ != (float)local_128._0_4_) ||
                   (NAN((float)local_128._16_4_) || NAN((float)local_128._0_4_))) {
LAB_00729910:
                  tcu::PixelBufferAccess::setPixel
                            (&local_b8,(Vec4 *)(local_128 + 0x10),iVar11,z_00,iVar9);
                }
                else {
                  uVar7 = 0xffffffffffffffff;
                  do {
                    if (uVar7 == 2) goto LAB_0072992c;
                    lVar13 = uVar7 + 1;
                    uVar1 = uVar7 + 1;
                    lVar3 = uVar7 - 3;
                  } while ((afStack_114[lVar13] == afStack_114[lVar3]) &&
                          (uVar7 = uVar1, !NAN(afStack_114[lVar13]) && !NAN(afStack_114[lVar3])));
                  if (uVar1 < 3) goto LAB_00729910;
                }
LAB_0072992c:
                iVar11 = iVar11 + 1;
                iVar8 = local_b8.super_ConstPixelBufferAccess.m_size.m_data[1];
                iVar12 = local_b8.super_ConstPixelBufferAccess.m_size.m_data[0];
              } while (iVar11 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[0]);
            }
            z_00 = z_00 + 1;
            readFormat = local_108;
            iVar11 = local_b8.super_ConstPixelBufferAccess.m_size.m_data[2];
          } while (z_00 < iVar8);
        }
        iVar9 = iVar9 + 1;
        imageSize = local_100;
        imageFormat = local_104;
      } while (iVar9 < iVar11);
    }
  }
  bVar4 = ::vk::isSnormFormat(readFormat);
  pTVar6 = (TextureLevel *)CONCAT71(extraout_var,bVar4);
  if ((imageFormat != readFormat) &&
     (pTVar6 = (TextureLevel *)(CONCAT71(extraout_var,bVar4) ^ 1), bVar4)) {
    local_c0 = ::vk::mapVkFormat(readFormat);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_90,&local_c0,imageSize,local_68.super_ConstPixelBufferAccess.m_data);
    pTVar6 = extraout_RAX;
    if (0 < local_90.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      iVar11 = 0;
      pTVar6 = (TextureLevel *)(ulong)(uint)local_90.super_ConstPixelBufferAccess.m_size.m_data[1];
      iVar9 = local_90.super_ConstPixelBufferAccess.m_size.m_data[2];
      do {
        if (0 < (int)pTVar6) {
          iVar12 = 0;
          iVar8 = local_90.super_ConstPixelBufferAccess.m_size.m_data[0];
          do {
            if (0 < iVar8) {
              iVar9 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_128,(int)&local_90,iVar9,iVar12);
                afStack_114[0] = (float)local_128._4_4_;
                local_128._16_4_ = local_128._0_4_;
                afStack_114[1] = (float)local_128._8_4_;
                afStack_114[2] = (float)local_128._12_4_;
                if ((float)local_128._0_4_ == -NAN) {
                  local_128._16_4_ = -0x7f;
                }
                if (local_128._4_4_ == 0xffffff80) {
                  afStack_114[0] = -NAN;
                }
                if (local_128._8_4_ == 0xffffff80) {
                  afStack_114[1] = -NAN;
                }
                if (local_128._12_4_ == 0xffffff80) {
                  afStack_114[2] = -NAN;
                }
                if (local_128._16_4_ == local_128._0_4_) {
                  uVar7 = 0xffffffffffffffff;
                  do {
                    if (uVar7 == 2) goto LAB_00729ad9;
                    lVar13 = uVar7 + 1;
                    uVar1 = uVar7 + 1;
                    lVar3 = uVar7 - 3;
                    uVar7 = uVar1;
                  } while (afStack_114[lVar13] == afStack_114[lVar3]);
                  if (uVar1 < 3) goto LAB_00729ac6;
                }
                else {
LAB_00729ac6:
                  tcu::PixelBufferAccess::setPixel
                            (&local_90,(IVec4 *)(local_128 + 0x10),iVar9,iVar12,iVar11);
                }
LAB_00729ad9:
                iVar9 = iVar9 + 1;
              } while (iVar9 < local_90.super_ConstPixelBufferAccess.m_size.m_data[0]);
              pTVar6 = (TextureLevel *)
                       (ulong)(uint)local_90.super_ConstPixelBufferAccess.m_size.m_data[1];
              iVar8 = local_90.super_ConstPixelBufferAccess.m_size.m_data[0];
            }
            iVar12 = iVar12 + 1;
            iVar9 = local_90.super_ConstPixelBufferAccess.m_size.m_data[2];
          } while (iVar12 < (int)pTVar6);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar9);
    }
  }
  return pTVar6;
}

Assistant:

tcu::TextureLevel generateReferenceImage (const tcu::IVec3& imageSize, const VkFormat imageFormat, const VkFormat readFormat)
{
	// Generate a reference image data using the storage format

	tcu::TextureLevel reference(mapVkFormat(imageFormat), imageSize.x(), imageSize.y(), imageSize.z());
	const tcu::PixelBufferAccess access = reference.getAccess();

	const float storeColorScale = computeStoreColorScale(imageFormat, imageSize);
	const float storeColorBias = computeStoreColorBias(imageFormat);

	const bool intFormat = isIntegerFormat(imageFormat);
	const int xMax = imageSize.x() - 1;
	const int yMax = imageSize.y() - 1;

	for (int z = 0; z < imageSize.z(); ++z)
	for (int y = 0; y < imageSize.y(); ++y)
	for (int x = 0; x < imageSize.x(); ++x)
	{
		const tcu::IVec4 color(x^y^z, (xMax - x)^y^z, x^(yMax - y)^z, (xMax - x)^(yMax - y)^z);

		if (intFormat)
			access.setPixel(color, x, y, z);
		else
			access.setPixel(color.asFloat()*storeColorScale + storeColorBias, x, y, z);
	}

	// If the image is to be accessed as a float texture, get rid of invalid values

	if (isFloatFormat(readFormat) && imageFormat != readFormat)
		replaceBadFloatReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));
	if (isSnormFormat(readFormat) && imageFormat != readFormat)
		replaceSnormReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));

	return reference;
}